

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZFront.cpp
# Opt level: O1

void __thiscall TPZFront<double>::Print(TPZFront<double> *this,char *name,ostream *out)

{
  char cVar1;
  size_t sVar2;
  
  cVar1 = (char)out;
  if (name != (char *)0x0) {
    sVar2 = strlen(name);
    std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar2);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (out,"Not implemented in the abstract Class !",0x27);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>(out,"Try one of the subclasses",0x19);
  std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
  std::ostream::put(cVar1);
  std::ostream::flush();
  return;
}

Assistant:

void TPZFront<TVar>::Print(const char *name, std::ostream& out) const
{
	if(name) out << name << endl;
	/*int i,j,loop_limit;
	 
	 
	 out <<  "Frontal Matrix Size          "<< fFront << endl;
	 out <<  "Maximum Frontal Matrix Size  "<< fMaxFront << endl;
	 
	 out << endl;
	 out <<  "Local Indexation "<< endl;
	 out <<  "Position  "<<" Local index"<< endl;
	 for(i=0;i<fLocal.NElements();i++){
	 out <<   i <<  "         "  << fLocal[i] << endl;
	 }
	 
	 out << endl;
	 out <<  "Global Indexation "<< endl;
	 out <<  "Position  "<<" Global index"<< endl;
	 
	 for(i=0;i<fGlobal.NElements();i++){
	 out <<   i <<  "            "<< fGlobal[i] << endl;
	 }
	 
	 out << endl;
	 out <<  "Local Freed Equatoins  "<< fFree.NElements() << endl;
	 out <<  "position "<<   "Local Equation "<<endl;
	 loop_limit=fFree.NElements();
	 for(i=0;i<loop_limit;i++){
	 out <<  i <<  "             " << fFree[i] << endl;
	 }
	 out <<  "Frontal Matrix "<< endl;
	 if(fData.NElements() > 0) {
	 for(i=0;i<fFront;i++){
	 for(j=0;j<fFront;j++) out << ((i<j) ? Element(i,j) : Element(j,i)) <<  " ";
	 out << endl;
	 }
	 }*/
	
	out << "Not implemented in the abstract Class !" << endl;
	out << "Try one of the subclasses" << endl;
}